

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Transform::updateTokenizationStore
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Transform *this,Path *path,Parameters *parameters)

{
  Client *client;
  string local_88;
  Path local_68;
  Url local_48;
  
  client = *(Client **)this;
  Vault::operator+(&local_88,"store/",path);
  local_68.value_._M_dataplus._M_p = (pointer)&local_68.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_68.value_.field_2._8_8_ = local_88.field_2._8_8_;
  }
  else {
    local_68.value_._M_dataplus._M_p = local_88._M_dataplus._M_p;
  }
  local_68.value_._M_string_length = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  getUrl(&local_48,this,&local_68);
  HttpConsumer::post(__return_storage_ptr__,client,&local_48,parameters);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Transform::updateTokenizationStore(const Path &path,
                                          const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{"store/" + path}), parameters);
}